

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

Vec_Bit_t * Acec_BoothFindPPG(Gia_Man_t *p)

{
  int iVar1;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  undefined4 local_24;
  int Entry;
  int i;
  Vec_Int_t *vMap;
  Vec_Bit_t *vIgnore;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  p_01 = Acec_MultFindPPs(p);
  for (local_24 = 0; iVar1 = Vec_IntSize(p_01), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(p_01,local_24);
    Vec_BitWriteEntry(p_00,iVar1,1);
  }
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_BoothFindPPG( Gia_Man_t * p )
{
    Vec_Bit_t * vIgnore = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap = Acec_MultFindPPs( p );
    int i, Entry;
    Vec_IntForEachEntry( vMap, Entry, i )
        Vec_BitWriteEntry( vIgnore, Entry, 1 );
    Vec_IntFree( vMap );
    return vIgnore;
}